

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixcomm.c
# Opt level: O2

LispPTR Unix_handlecomm(LispPTR *args)

{
  int iVar1;
  __pid_t __pgrp;
  int iVar2;
  uint uVar3;
  LispPTR *pLVar4;
  long lVar5;
  uint *puVar6;
  size_t sVar7;
  ssize_t sVar8;
  int *piVar9;
  long lVar10;
  int extraout_EDX;
  int extraout_EDX_00;
  int c;
  int c_00;
  DLword *pDVar11;
  LispPTR LVar12;
  ulong uVar13;
  char *pcVar14;
  uint uVar15;
  LispPTR LVar16;
  bool bVar17;
  byte local_b0;
  byte local_af;
  byte bStack_ae;
  byte bStack_ad;
  byte bStack_ac;
  byte bStack_ab;
  unsigned_short len;
  uchar ch;
  undefined1 uStack_a7;
  uint6 local_a6 [11];
  undefined4 uStack_4e;
  undefined4 uStack_4a;
  undefined4 uStack_46;
  undefined8 uStack_42;
  
  uVar3 = *args;
  if ((uVar3 & 0xfff0000) == 0xf0000) {
    LVar16 = uVar3 | 0xffff0000;
  }
  else if ((uVar3 & 0xfff0000) == 0xe0000) {
    LVar16 = uVar3 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(uVar3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      return 0;
    }
    pLVar4 = NativeAligned4FromLAddr(uVar3);
    LVar16 = *pLVar4;
  }
  switch(LVar16) {
  case 0:
    iVar2 = socket(1,1,0);
    if (-1 < iVar2) {
      build_socket_pathname(iVar2);
      local_a6[0]._0_8_ = 0;
      local_a6[1]._0_8_ = 0;
      local_a6[2]._0_8_ = 0;
      local_a6[3]._0_8_ = 0;
      local_a6[4]._0_8_ = 0;
      local_a6[5]._0_8_ = 0;
      local_a6[6]._0_8_ = 0;
      local_a6[7]._0_8_ = 0;
      local_a6[8]._0_8_ = 0;
      local_a6[9]._0_8_ = 0;
      local_a6[10]._0_8_ = 0;
      uStack_4e = 0;
      uStack_4a = 0;
      uStack_46 = 0;
      uStack_42 = 0;
      _ch = 1;
      strcpy((char *)local_a6,build_socket_pathname::PathName);
      iVar1 = bind(iVar2,(sockaddr *)&ch,0x6e);
      if (iVar1 < 0) {
        close(iVar2);
        perror("binding sockets");
LAB_0012fed5:
        unlink(build_socket_pathname::PathName);
        return 0;
      }
      iVar1 = listen(iVar2,1);
      if (iVar1 < 0) {
        perror("Listen");
      }
      local_af = 0;
      bStack_ae = 0;
      bStack_ac = 0;
      bStack_ab = 0;
      local_b0 = 0x46;
      bStack_ad = (byte)iVar2;
      write(UnixPipeOut,&local_b0,6);
      WriteLispStringToPipe(args[1]);
      SAFEREAD(UnixPipeIn,&local_b0,c);
      if (bStack_ad != 1) {
        close(iVar2);
        goto LAB_0012fed5;
      }
      do {
        alarm(TIMEOUT_TIME);
        piVar9 = __errno_location();
        do {
          *piVar9 = 0;
          uVar3 = accept(iVar2,(sockaddr *)0x0,(socklen_t *)0x0);
          if (uVar3 != 0xffffffff) break;
        } while (*piVar9 == 4);
        alarm(0);
        if (-1 < (int)uVar3) {
          uVar15 = fcntl(uVar3,3,0);
          iVar1 = fcntl(uVar3,4,(ulong)(uVar15 | 0x800));
          if (iVar1 == -1) {
            pcVar14 = "setting up fifo to nodelay";
            goto LAB_00130a5e;
          }
          uVar13 = (ulong)uVar3;
          UJ[uVar13].type = UJPROCESS;
          UJ[uVar13].status = -1;
          UJ[uVar13].PID =
               CONCAT13(bStack_ab,
                        CONCAT12(bStack_ac,CONCAT11(bStack_ae,local_af) << 8 | (ushort)bStack_ae));
          close(iVar2);
          unlink(build_socket_pathname::PathName);
          goto LAB_001307ed;
        }
      } while (*piVar9 == 4);
      perror("Accept.");
      close(iVar2);
      iVar2 = unlink(build_socket_pathname::PathName);
      if (-1 < iVar2) {
        return 0;
      }
      pcVar14 = "Unlink";
      goto LAB_00130a5e;
    }
    goto LAB_00130a57;
  case 1:
    uVar3 = args[1];
    if ((uVar3 & 0xfff0000) == 0xf0000) {
      LVar16 = uVar3 | 0xffff0000;
    }
    else if ((uVar3 & 0xfff0000) == 0xe0000) {
      LVar16 = uVar3 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      pLVar4 = NativeAligned4FromLAddr(uVar3);
      LVar16 = *pLVar4;
    }
    uVar3 = args[2];
    if ((uVar3 & 0xfff0000 | 0x10000) != 0xf0000) {
      if ((*(ushort *)((ulong)(uVar3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      pLVar4 = NativeAligned4FromLAddr(uVar3);
      uVar3 = *pLVar4;
    }
    _ch = CONCAT11(uStack_a7,(char)uVar3);
    if ((int)LVar16 < 0) {
      return 0;
    }
    if (NPROCS <= (int)LVar16) {
      return 0;
    }
    if (UJ[LVar16].type == UJUNUSED) {
      return 0;
    }
    if (UJ[LVar16].status != -1) {
      return 0;
    }
    uVar3 = UJ[LVar16].type + 4;
    if (3 < uVar3) {
      return 0;
    }
    if (uVar3 == 1) {
      return 0;
    }
    sVar8 = write(LVar16,&ch,1);
    if ((int)sVar8 != 0) {
      return 0xe0001;
    }
    wait_for_comm_processes();
    return 0;
  case 2:
    uVar3 = args[1];
    if ((uVar3 & 0xfff0000) == 0xf0000) {
      LVar16 = uVar3 | 0xffff0000;
    }
    else if ((uVar3 & 0xfff0000) == 0xe0000) {
      LVar16 = uVar3 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      pLVar4 = NativeAligned4FromLAddr(uVar3);
      LVar16 = *pLVar4;
    }
    if ((int)LVar16 < 0) {
      return 0;
    }
    if (NPROCS <= (int)LVar16) {
      return 0;
    }
    uVar3 = UJ[LVar16].type + 4;
    if (uVar3 < 5) {
      if ((0xdU >> (uVar3 & 0x1f) & 1) == 0) {
        return 0;
      }
      alarm(TIMEOUT_TIME);
      piVar9 = __errno_location();
      do {
        *piVar9 = 0;
        sVar8 = read(LVar16,&ch,1);
        iVar2 = (int)sVar8;
        if (iVar2 != -1) break;
      } while (*piVar9 == 4);
      alarm(0);
      if (iVar2 < 1) {
        wait_for_comm_processes();
        if (iVar2 == 0) {
          if (UJ[LVar16].status == -1) {
            return 0x4c;
          }
          return 0;
        }
        if (UJ[LVar16].status == -1) {
          if (*piVar9 == 0xb) {
            return 0x4c;
          }
          return 0;
        }
        return 0;
      }
      uVar13 = (ulong)ch;
      goto LAB_00130b08;
    }
  case 3:
    uVar3 = args[1];
    if ((uVar3 & 0xfff0000) == 0xf0000) {
      LVar16 = uVar3 | 0xffff0000;
    }
    else if ((uVar3 & 0xfff0000) == 0xe0000) {
      LVar16 = uVar3 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      pLVar4 = NativeAligned4FromLAddr(uVar3);
      LVar16 = *pLVar4;
    }
    if ((int)LVar16 < 0) {
      return 0x4c;
    }
    if (NPROCS <= (int)LVar16) {
      return 0x4c;
    }
    if (UJ[LVar16].type == UJUNUSED) {
      return 0x4c;
    }
    close(LVar16);
    if ((uint)(UJ[LVar16].type + ~UJSOCKET) < 2) {
      iVar2 = 10;
      while ((bVar17 = iVar2 != 0, iVar2 = iVar2 + -1, bVar17 &&
             (wait_for_comm_processes(), UJ[LVar16].status == -1))) {
        usleep(10000);
      }
      if (UJ[LVar16].status == -1) {
        kill(UJ[LVar16].PID,9);
        iVar2 = 0xb;
        do {
          iVar2 = iVar2 + -1;
          if (iVar2 == 0) break;
          wait_for_comm_processes();
          usleep(10000);
        } while (UJ[LVar16].status == -1);
      }
    }
    else if ((UJ[LVar16].type == UJSOCKET) && (UJ[LVar16].pathname != (char *)0x0)) {
      iVar2 = unlink(UJ[LVar16].pathname);
      if (iVar2 < 0) {
        perror("Kill 3 unlink");
      }
      free(UJ[LVar16].pathname);
      UJ[LVar16].pathname = (char *)0x0;
    }
    UJ[LVar16].type = UJUNUSED;
    UJ[LVar16].PID = 0;
    UJ[LVar16].pathname = (char *)0x0;
    uVar13 = (ulong)UJ[LVar16].status;
LAB_00130b08:
    LVar16 = GetSmallp(uVar13);
    return LVar16;
  case 4:
  case 0xb:
    uVar3 = posix_openpt(2);
    if ((int)uVar3 < 0) {
      perror("open_pt failed");
      puts("Open of lisp side of PTY failed.");
      fflush(_stdout);
      return 0;
    }
    grantpt(uVar3);
    unlockpt(uVar3);
    pcVar14 = ptsname(uVar3);
    strcpy((char *)&ch,pcVar14);
    uVar15 = fcntl(uVar3,3,0);
    fcntl(uVar3,4,(ulong)(uVar15 | 0x800));
    local_b0 = (LVar16 == 4) * '\x03' | 0x50;
    local_af = (byte)_ch;
    bStack_ae = (byte)(_ch >> 8);
    bStack_ad = (byte)uVar3;
    bStack_ac = 0;
    bStack_ab = 0;
    write(UnixPipeOut,&local_b0,6);
    sVar7 = strlen((char *)&ch);
    uVar15 = (int)sVar7 + 1;
    len = (unsigned_short)uVar15;
    write(UnixPipeOut,&len,2);
    write(UnixPipeOut,&ch,(ulong)(uVar15 & 0xffff));
    iVar2 = extraout_EDX;
    if (LVar16 != 4) {
      WriteLispStringToPipe(args[1]);
      WriteLispStringToPipe(args[2]);
      iVar2 = extraout_EDX_00;
    }
    SAFEREAD(UnixPipeIn,&local_b0,iVar2);
    uVar15 = (uint)bStack_ad;
    if (uVar15 != 1) {
      puts("Fork failed.");
      fflush(_stdout);
      printf("d = %d, %d, %d, %d, %d, %d\n",(ulong)local_b0,(ulong)local_af,(ulong)bStack_ae,
             (ulong)uVar15,(ulong)bStack_ac,(uint)bStack_ab);
      close(uVar3);
      return 0;
    }
    uVar15 = fcntl(uVar3,3,0);
    fcntl(uVar3,4,(ulong)(uVar15 | 0x800));
    uVar13 = (ulong)uVar3;
    UJ[uVar13].type = UJSHELL;
    UJ[uVar13].PID =
         CONCAT13(bStack_ab,
                  CONCAT12(bStack_ac,CONCAT11(bStack_ae,local_af) << 8 | (ushort)bStack_ae));
    printf("Shell job %d, PID = %d\n",(ulong)uVar3,(ulong)(uint)UJ[uVar13].PID);
    UJ[uVar13].status = -1;
    goto LAB_001307ed;
  case 5:
    close_unix_descriptors();
    break;
  case 6:
    bStack_ae = 0;
    bStack_ad = 0;
    bStack_ac = 0;
    bStack_ab = 0;
    local_b0 = 0x43;
    uVar3 = args[1];
    if ((uVar3 & 0xfff0000) == 0xf0000) {
      LVar16 = uVar3 | 0xffff0000;
    }
    else if ((uVar3 & 0xfff0000) == 0xe0000) {
      LVar16 = uVar3 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      pLVar4 = NativeAligned4FromLAddr(uVar3);
      LVar16 = *pLVar4;
    }
    local_af = (byte)LVar16;
    bStack_ad = 1;
    write(UnixPipeOut,&local_b0,6);
    SAFEREAD(UnixPipeIn,&local_b0,c_00);
    switch(UJ[(int)LVar16].type) {
    case UJSOSTREAM:
    case UJPROCESS:
    case UJSHELL:
      close(LVar16);
      break;
    case UJSOCKET:
      close(LVar16);
      if (UJ[(int)LVar16].pathname != (char *)0x0) {
        unlink(UJ[(int)LVar16].pathname);
        free(UJ[(int)LVar16].pathname);
        UJ[(int)LVar16].pathname = (char *)0x0;
      }
    }
    UJ[(int)LVar16].type = UJUNUSED;
    UJ[(int)LVar16].PID = 0;
    break;
  case 7:
    uVar3 = args[1];
    if ((uVar3 & 0xfff0000) == 0xf0000) {
      LVar16 = uVar3 | 0xffff0000;
    }
    else if ((uVar3 & 0xfff0000) == 0xe0000) {
      LVar16 = uVar3 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      pLVar4 = NativeAligned4FromLAddr(uVar3);
      LVar16 = *pLVar4;
    }
    wait_for_comm_processes();
    uVar13 = (ulong)UJ[(int)LVar16].status;
    if (uVar13 == 0xffffffffffffffff) {
      return 0x4c;
    }
    goto LAB_00130b08;
  case 8:
    return 0xe000f;
  case 9:
    uVar3 = args[1];
    if ((uVar3 & 0xfff0000) == 0xf0000) {
      LVar16 = uVar3 | 0xffff0000;
    }
    else if ((uVar3 & 0xfff0000) == 0xe0000) {
      LVar16 = uVar3 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      pLVar4 = NativeAligned4FromLAddr(uVar3);
      LVar16 = *pLVar4;
    }
    if ((int)LVar16 < 0) {
      return 0;
    }
    if (NPROCS <= (int)LVar16) {
      return 0;
    }
    uVar3 = UJ[LVar16].type + 4;
    if (uVar3 < 5) {
      if ((0xdU >> (uVar3 & 0x1f) & 1) == 0) {
        return 0;
      }
      pDVar11 = Lisp_world + args[2];
      sVar8 = read(LVar16,pDVar11,0x200);
      uVar3 = (uint)sVar8;
      word_swap_page(pDVar11,0x80);
      if (0 < (int)uVar3) goto LAB_00130901;
      wait_for_comm_processes();
      if (uVar3 != 0) {
        puVar6 = (uint *)__errno_location();
        if (0xb < *puVar6) {
          return 0;
        }
        if ((0x811U >> (*puVar6 & 0x1f) & 1) == 0) {
          return 0;
        }
      }
      iVar2 = UJ[LVar16].status;
      goto joined_r0x001309ee;
    }
  case 10:
    uVar3 = args[1];
    if ((uVar3 & 0xfff0000) == 0xf0000) {
      LVar16 = uVar3 | 0xffff0000;
    }
    else if ((uVar3 & 0xfff0000) == 0xe0000) {
      LVar16 = uVar3 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      pLVar4 = NativeAligned4FromLAddr(uVar3);
      LVar16 = *pLVar4;
    }
    uVar3 = args[2];
    if ((uVar3 & 0xfff0000 | 0x10000) != 0xf0000) {
      if ((*(ushort *)((ulong)(uVar3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      pLVar4 = NativeAligned4FromLAddr(uVar3);
      uVar3 = *pLVar4;
    }
    uVar15 = args[3];
    if ((uVar15 & 0xfff0000 | 0x10000) != 0xf0000) {
      if ((*(ushort *)((ulong)(uVar15 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      pLVar4 = NativeAligned4FromLAddr(uVar15);
      uVar15 = *pLVar4;
    }
    if ((int)LVar16 < 0) {
      return 0;
    }
    if (NPROCS <= (int)LVar16) {
      return 0;
    }
    if (UJ[LVar16].type != UJSHELL) {
      return 0;
    }
    if (UJ[LVar16].status != -1) {
      return 0;
    }
    _ch = (sa_family_t)uVar3;
    local_a6[0] = (uint6)(ushort)uVar15;
    iVar2 = ioctl(LVar16,0x5414);
    if (((iVar2 < 0) || (__pgrp = tcgetpgrp(LVar16), __pgrp < 0)) ||
       (iVar2 = killpg(__pgrp,0x1c), iVar2 < 0)) {
      piVar9 = __errno_location();
      uVar13 = (ulong)*piVar9;
LAB_001307ed:
      LVar16 = GetSmallp(uVar13);
      return LVar16;
    }
    break;
  case 0xc:
    uVar3 = socket(1,1,0);
    if (-1 < (int)uVar3) {
      pLVar4 = NativeAligned4FromLAddr(args[1]);
      pDVar11 = Lisp_world;
      LVar16 = 0x800;
      if ((int)pLVar4[2] < 0x800) {
        LVar16 = pLVar4[2];
      }
      lVar10 = (long)(int)LVar16;
      if (*(char *)((long)pLVar4 + 6) == 'D') {
        pDVar11 = Lisp_world + (ulong)(ushort)pLVar4[1] + (ulong)(*pLVar4 & 0xfffffff);
        for (lVar5 = 0; lVar10 != lVar5; lVar5 = lVar5 + 1) {
          shcom[lVar5] = *(char *)((ulong)pDVar11 ^ 2);
          pDVar11 = pDVar11 + 1;
        }
        shcom[lVar5] = '\0';
      }
      else if (*(char *)((long)pLVar4 + 6) == 'C') {
        uVar15 = *pLVar4;
        LVar16 = pLVar4[1];
        for (lVar5 = 0; lVar10 != lVar5; lVar5 = lVar5 + 1) {
          shcom[lVar5] = *(char *)((long)pDVar11 +
                                   lVar5 + (ulong)(ushort)LVar16 + (ulong)(uVar15 & 0xfffffff) * 2 ^
                                  3);
        }
        shcom[lVar10] = '\0';
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      sVar7 = strlen(shcom);
      pcVar14 = (char *)malloc(sVar7 + 1);
      uVar13 = (ulong)uVar3;
      UJ[uVar13].pathname = pcVar14;
      strcpy(UJ[uVar13].pathname,shcom);
      _ch = 1;
      strcpy((char *)local_a6,shcom);
      iVar2 = bind(uVar3,(sockaddr *)&ch,0x6e);
      if (iVar2 < 0) {
        close(uVar3);
        free(UJ[uVar13].pathname);
        UJ[uVar13].type = UJUNUSED;
        pcVar14 = "binding Lisp sockets";
        goto LAB_00130b4a;
      }
      iVar2 = listen(uVar3,1);
      if (iVar2 < 0) {
        perror("Listen");
      }
      uVar15 = fcntl(uVar3,3,0);
      fcntl(uVar3,4,(ulong)(uVar15 | 0x800));
      UJ[uVar13].status = -1;
      UJ[uVar13].PID = -1;
      UJ[uVar13].type = UJSOCKET;
      goto LAB_001307ed;
    }
LAB_00130a57:
    pcVar14 = "socket open";
LAB_00130a5e:
    perror(pcVar14);
    return 0;
  case 0xd:
    uVar3 = args[1];
    if ((uVar3 & 0xfff0000) == 0xf0000) {
      LVar16 = uVar3 | 0xffff0000;
    }
    else if ((uVar3 & 0xfff0000) == 0xe0000) {
      LVar16 = uVar3 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      pLVar4 = NativeAligned4FromLAddr(uVar3);
      LVar16 = *pLVar4;
    }
    if (UJ[(int)LVar16].type != UJSOCKET) {
      return 0;
    }
    if (UJ[(int)LVar16].pathname == (char *)0x0) {
      return 0;
    }
    do {
      alarm(TIMEOUT_TIME);
      piVar9 = __errno_location();
      do {
        *piVar9 = 0;
        uVar3 = accept(LVar16,(sockaddr *)0x0,(socklen_t *)0x0);
        if (uVar3 != 0xffffffff) break;
      } while (*piVar9 == 4);
      alarm(0);
      if (-1 < (int)uVar3) {
        uVar13 = (ulong)uVar3;
        UJ[uVar13].status = -1;
        UJ[uVar13].PID = -1;
        UJ[uVar13].type = UJSOSTREAM;
        goto LAB_00130b08;
      }
    } while (*piVar9 == 4);
    if (*piVar9 == 0xb) {
      return 0xfffff;
    }
    pcVar14 = "Lisp socket accept";
LAB_00130b4a:
    perror(pcVar14);
    return 0;
  case 0xe:
    uVar3 = args[1];
    if ((uVar3 & 0xfff0000) == 0xf0000) {
      LVar16 = uVar3 | 0xffff0000;
    }
    else if ((uVar3 & 0xfff0000) == 0xe0000) {
      LVar16 = uVar3 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      pLVar4 = NativeAligned4FromLAddr(uVar3);
      LVar16 = *pLVar4;
    }
    if ((int)LVar16 < 0) {
      return 0;
    }
    if (NPROCS <= (int)LVar16) {
      return 0;
    }
    uVar13 = (ulong)UJ[LVar16].type;
    if (uVar13 == 0) {
      return 0;
    }
    goto LAB_00130b08;
  case 0xf:
    uVar3 = args[1];
    if ((uVar3 & 0xfff0000) == 0xf0000) {
      LVar16 = uVar3 | 0xffff0000;
    }
    else if ((uVar3 & 0xfff0000) == 0xe0000) {
      LVar16 = uVar3 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      pLVar4 = NativeAligned4FromLAddr(uVar3);
      LVar16 = *pLVar4;
    }
    pDVar11 = Lisp_world + args[2];
    uVar3 = args[3];
    if ((uVar3 & 0xfff0000) == 0xf0000) {
      LVar12 = uVar3 | 0xffff0000;
    }
    else if ((uVar3 & 0xfff0000) == 0xe0000) {
      LVar12 = uVar3 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      pLVar4 = NativeAligned4FromLAddr(uVar3);
      LVar12 = *pLVar4;
    }
    uVar3 = UJ[(int)LVar16].type + 4;
    if (4 < uVar3) {
      return 0;
    }
    if ((0xdU >> (uVar3 & 0x1f) & 1) == 0) {
      return 0;
    }
    uVar15 = (int)(LVar12 + 3) >> 2;
    word_swap_page(pDVar11,uVar15);
    sVar8 = write(LVar16,pDVar11,(long)(int)LVar12);
    uVar3 = (uint)sVar8;
    word_swap_page(pDVar11,uVar15);
    if (0 < (int)uVar3) {
LAB_00130901:
      uVar13 = (ulong)(uVar3 & 0x7fffffff);
      goto LAB_00130b08;
    }
    wait_for_comm_processes();
    if ((uVar3 != 0) && (piVar9 = __errno_location(), *piVar9 != 0xb)) {
      return 0;
    }
    iVar2 = UJ[(int)LVar16].status;
joined_r0x001309ee:
    if (iVar2 != -1) {
      return 0;
    }
    break;
  default:
    return 0;
  }
  return 0x4c;
}

Assistant:

LispPTR Unix_handlecomm(LispPTR *args) {
  int command, dest, slot;
  unsigned char d[6];
  unsigned char ch;
  unsigned char buf[1];

  /* Get command */
  N_GETNUMBER(args[0], command, bad);
  DBPRINT(("\nUnix_handlecomm: command %d\n", command));

  switch (command) {
    case 0: /* Fork pipe process */
    {
      char *PipeName;
      int PipeFD, sockFD;

      /* First create the socket */
      struct sockaddr_un sock;
      sockFD = socket(AF_UNIX, SOCK_STREAM, 0);
      if (sockFD < 0) {
        perror("socket open");
        return (NIL);
      }

      /* then bind it to a canonical pathname */
      PipeName = build_socket_pathname(sockFD);
      memset(&sock, 0, sizeof(sock));
      sock.sun_family = AF_UNIX;
      strcpy(sock.sun_path, PipeName);
      if (bind(sockFD, (struct sockaddr *)&sock, sizeof(struct sockaddr_un)) < 0) {
        close(sockFD);
        perror("binding sockets");
        unlink(PipeName);
        return (NIL);
      }

      DBPRINT(("Socket %d bound to name %s.\n", sockFD, PipeName));

      if (listen(sockFD, 1) < 0) perror("Listen");

      memset(d, 0, sizeof(d));
      d[0] = 'F';
      d[3] = sockFD;
      write(UnixPipeOut, d, 6);
      WriteLispStringToPipe(args[1]);

      DBPRINT(("Sending cmd string: %s\n", shcom));

      /* Get status */
      SAFEREAD(UnixPipeIn, d, 6);

      /* If it worked, return job # */
      if (d[3] == 1) {
      case0_lp:
        TIMEOUT(PipeFD = accept(sockFD, NULL, NULL));
        if (PipeFD < 0) {
          if (errno == EINTR) goto case0_lp;
          perror("Accept.");
          close(sockFD);
          if (unlink(PipeName) < 0) perror("Unlink");
          return (NIL);
        }
        if (fcntl(PipeFD, F_SETFL, fcntl(PipeFD, F_GETFL, 0) | O_NONBLOCK) == -1) {
          perror("setting up fifo to nodelay");
          return (NIL);
        }
        UJ[PipeFD].type = UJPROCESS;
        UJ[PipeFD].status = -1;
        UJ[PipeFD].PID = (d[1] << 8) | d[2] | (d[4] << 16) | (d[5] << 24);
        close(sockFD);
        unlink(PipeName);
        DBPRINT(("New process: slot/PipeFD %d PID %d\n", PipeFD, UJ[PipeFD].PID));
        return (GetSmallp(PipeFD));
      } else {
        DBPRINT(("Fork request failed."));
        close(sockFD);
        unlink(PipeName);
        return (NIL);
      }
    }

    case 1: /* Write byte */
      /* Get job #, Byte */
      N_GETNUMBER(args[1], slot, bad);
      N_GETNUMBER(args[2], dest, bad);
      ch = dest; /* ch is a char */

      if (valid_slot(slot) && (UJ[slot].status == -1)) switch (UJ[slot].type) {
          case UJPROCESS:
          case UJSHELL:
          case UJSOSTREAM:
            dest = write(slot, &ch, 1);
            if (dest == 0) {
              wait_for_comm_processes();
              return (NIL);
            } else
              return (GetSmallp(1));

	  case UJSOCKET:
	  case UJUNUSED:
	    return (NIL);
        }
      break;

    case 2: /* Read byte */
      /**********************************************************/
      /* 							    */
      /* NB that it is possible for the other end of the stream */
      /* to have terminated, and hence status != -1.	    */
      /* EVEN IF THERE ARE STILL CHARACTERS TO READ.	    */
      /* 							    */
      /**********************************************************/

      N_GETNUMBER(args[1], slot, bad); /* Get job # */

      if (!valid_slot(slot)) return (NIL); /* No fd open; punt the read */
      switch (UJ[slot].type) {
        case UJPROCESS:
        case UJSHELL:
        case UJSOSTREAM:
          TIMEOUT(dest = read(slot, buf, 1));
          if (dest > 0) return (GetSmallp(buf[0]));
          /* Something's amiss; check our process status */
          wait_for_comm_processes();
          if ((dest == 0) &&
              (UJ[slot].status == -1)) { /* No available chars, but other guy still running */
            DBPRINT(("dest = 0, status still -1\n"));
            return (ATOM_T);
          }
          if ((UJ[slot].status == -1) &&
              ((errno == EWOULDBLOCK) ||
               (errno == EAGAIN))) { /* No available chars, but other guy still running */
            DBPRINT((" dest<0, EWOULDBLOCK\n"));
            return (ATOM_T);
          }
          /* At this point, we either got an I/O error, or there */
          /* were no chars available and the other end has terminated. */
          /* Either way, signal EOF. */
          DBPRINT(("Indicating EOF from PTY desc %d.\n", slot));
          return (NIL);

	case UJSOCKET:
	case UJUNUSED:
	    return (NIL);
      }

    case 3: /* Kill process */
            /* Maiko uses this as CLOSEF, so "process" is a misnomer */

      N_GETNUMBER(args[1], slot, bad);

      DBPRINT(("Terminating process in slot %d.\n", slot));
      if (!valid_slot(slot)) return (ATOM_T);
      /* in all cases we need to close() the file descriptor */
      if (slot == 0) DBPRINT(("ZERO SLOT\n"));
      close(slot);
      switch (UJ[slot].type) {
      case UJSHELL:
      case UJPROCESS:
        /* wait for up to 0.1s for it to exit on its own after the close() */
        for (int i = 0; i < 10; i++) {
          wait_for_comm_processes();
          if (UJ[slot].status != -1) break;
          usleep(10000);
        }
        /* check again before we terminate it */
        if (UJ[slot].status != -1) break;
        kill(UJ[slot].PID, SIGKILL);
        for (int i = 0; i < 10; i++) {
          /* Waiting for the process to exit is possibly risky.
             Sending SIGKILL is always supposed to kill
             a process, but on very rare occurrences this doesn't
             happen because of a Unix kernel bug, usually a user-
             written device driver which hasn't been fully
             debugged.  So we time it out just be safe. */
          wait_for_comm_processes();
          usleep(10000);
          if (UJ[slot].status != -1) break;
        }
        break;
      case UJSOCKET:
        if (UJ[slot].pathname) {
          DBPRINT(("Unlinking %s\n", UJ[slot].pathname));
          if (unlink(UJ[slot].pathname) < 0) perror("Kill 3 unlink");
          free(UJ[slot].pathname);
          UJ[slot].pathname = NULL;
        }
        break;
      case UJSOSTREAM:
      case UJUNUSED:
	break;
      }
      UJ[slot].type = UJUNUSED;
      UJ[slot].PID = 0;
      UJ[slot].pathname = NULL;

      /* If status available, return it, otherwise T */
      return (GetSmallp(UJ[slot].status));

    case 4:
    case 11: /* Fork PTY process */
    {
      char SlavePTY[32];
      int Master;
      unsigned short len;

      Master = FindAvailablePty(SlavePTY);
      DBPRINT(("Fork Shell; Master PTY = %d. Slave=%c%c.\n", Master, SlavePTY[0], SlavePTY[1]));
      if (Master < 0) {
        printf("Open of lisp side of PTY failed.\n");
        fflush(stdout);
        return (NIL);
      }

      d[0] = (command == 4) ? 'S' : 'P';
      d[1] = SlavePTY[0];
      d[2] = SlavePTY[1];
      d[3] = Master;
      d[4] = '\0';
      d[5] = '\0';
      write(UnixPipeOut, d, 6);

      len = strlen(SlavePTY) + 1;
      write(UnixPipeOut, &len, 2);
      write(UnixPipeOut, SlavePTY, len);

      if (command != 4) { /* New style has arg1 = termtype, arg2 = command */
        WriteLispStringToPipe(args[1]);
        WriteLispStringToPipe(args[2]);
      }

      /* Get status */
      SAFEREAD(UnixPipeIn, d, 6);

      /* If successful, return job # */
      DBPRINT(("Pipe/fork result = %d.\n", d[3]));
      if (d[3] == 1) {
        /* Set up the IO not to block */
        fcntl(Master, F_SETFL, fcntl(Master, F_GETFL, 0) | O_NONBLOCK);

        UJ[Master].type = UJSHELL; /* so we can find them */
        UJ[Master].PID = (d[1] << 8) | d[2] | (d[4] << 16) | (d[5] << 24);
        printf("Shell job %d, PID = %d\n", Master, UJ[Master].PID);
        UJ[Master].status = -1;
        DBPRINT(("Forked pty in slot %d.\n", Master));
        return (GetSmallp(Master));
      } else {
        printf("Fork failed.\n");
        fflush(stdout);
        printf("d = %d, %d, %d, %d, %d, %d\n", d[0], d[1], d[2], d[3], d[4], d[5]);
        close(Master);
        return (NIL);
      }
    }

    case 5: /* Kill all the subprocesses */ close_unix_descriptors(); return (ATOM_T);

    case 6: /* Kill this subprocess */
      memset(d, 0, sizeof(d));
      d[0] = 'C';

      /* Get job # */
      N_GETNUMBER(args[1], dest, bad);
      d[1] = dest;

      d[3] = 1;
      write(UnixPipeOut, d, 6);

      /* Get status */
      SAFEREAD(UnixPipeIn, d, 6);

      switch (UJ[dest].type) {
        case UJUNUSED:
          break;

        case UJSHELL:
          DBPRINT(("Kill 5 closing shell desc %d.\n", dest));
          close(dest);
          break;

        case UJPROCESS:
          DBPRINT(("Kill 5 closing process desc %d.\n", dest));
          close(dest);
          break;

        case UJSOCKET:
          /* close a socket; be sure and unlink the file handle */
          DBPRINT(("Kill 5 closing raw socket desc %d.\n", dest));
          close(dest);
          if (UJ[dest].pathname != NULL) {
            unlink(UJ[dest].pathname);
            free(UJ[dest].pathname);
            UJ[dest].pathname = NULL;
          } /* else return an error somehow... */
          break;

        case UJSOSTREAM:
          DBPRINT(("Kill 5 closing socket stream %d.\n", dest));
          close(dest);
          break;
      }

      UJ[dest].type = UJUNUSED;
      UJ[dest].PID = 0;
      return (ATOM_T);
    /* break; */

    case 7: /* Current job status */

      N_GETNUMBER(args[1], slot, bad); /* Get job # */
      wait_for_comm_processes();       /* Make sure we're up to date */

      if (UJ[slot].status == -1)
        return (ATOM_T);
      else
        return (GetSmallp(UJ[slot].status));

    case 8: /* Return largest supported command */ return (GetSmallp(15));

    case 9: /* Read buffer */
      /**********************************************************/
      /* 							    */
      /* NB that it is possible for the other end of the stream */
      /* to have terminated, and hence ForkedStatus != -1.	    */
      /* EVEN IF THERE ARE STILL CHARACTERS TO READ.	    */
      /* 							    */
      /**********************************************************/

      {
        DLword *bufp;
        int terno; /* holds errno thru sys calls after I/O fails */

        N_GETNUMBER(args[1], slot, bad);     /* Get job # */
        if (!valid_slot(slot)) return (NIL); /* No fd open; punt the read */

        bufp = (NativeAligned2FromLAddr(args[2])); /* User buffer */
        DBPRINT(("Read buffer slot %d, type is %d buffer LAddr 0x%x (native %p)\n", slot, UJ[slot].type, args[2], bufp));

        switch (UJ[slot].type) {
          case UJSHELL:
          case UJPROCESS:
          case UJSOSTREAM: dest = read(slot, bufp, 512);
#ifdef BYTESWAP
            word_swap_page(bufp, 128);
#endif /* BYTESWAP */

            if (dest > 0) { /* Got characters.  If debugging, print len &c */
              /* printf("got %d chars\n", dest); */
              return (GetSmallp(dest));
            }

            /* Something's amiss; update process status */
            DBPRINT(("Problem: Got status %d from read, errno %d.\n", dest, errno));
            wait_for_comm_processes(); /* make sure we're up to date */
            if (((dest == 0) || (errno == EINTR) || (errno == 0) || (errno == EAGAIN) ||
                 (errno == EWOULDBLOCK)) &&
                (UJ[slot].status == -1))
              /* No available chars, but other guy still running */
              return (ATOM_T);

            /* At this point, we either got an I/O error, or there */
            /* were no chars available and the other end has terminated. */
            /* Either way, signal EOF. */
            DBPRINT(("read failed; dest = %d, errno = %d, status = %d\n", dest, terno,
                     UJ[slot].status));
            DBPRINT(("Indicating EOF from PTY desc %d.\n", slot));
            return (NIL);

          case UJSOCKET:
          case UJUNUSED:
            return (NIL);
        }
      }

    case 10: /* Change window */
    {
      int rows, cols, pgrp, pty;
      struct winsize w;

      /* Get job #, rows, columns */
      N_GETNUMBER(args[1], slot, bad);
      N_GETNUMBER(args[2], rows, bad);
      N_GETNUMBER(args[3], cols, bad);

      if (valid_slot(slot) && (UJ[slot].type == UJSHELL) && (UJ[slot].status == -1)) {
        w.ws_row = rows;
        w.ws_col = cols;
        w.ws_xpixel = 0; /* not used */
        w.ws_ypixel = 0;
        pty = slot;
        /* Change window size, then
           notify process group of the change */
        if ((ioctl(pty, TIOCSWINSZ, &w) >= 0) &&
            ((pgrp = tcgetpgrp(pty)) >= 0) &&
            (killpg(pgrp, SIGWINCH) >= 0))
          return (ATOM_T);
        return (GetSmallp(errno));
      }

      return (NIL);
    }

    case 12: /* create Unix socket */

    {
      int sockFD;
      struct sockaddr_un sock;

      /* First open the socket */
      sockFD = socket(AF_UNIX, SOCK_STREAM, 0);
      if (sockFD < 0) {
        perror("socket open");
        return (NIL);
      }
      /* Then get a process slot and blit the pathname of the
         socket into it */
      /* need to type-check the string here */
      LispStringToCString(args[1], shcom, 2048);
      UJ[sockFD].pathname = malloc(strlen(shcom) + 1);
      strcpy(UJ[sockFD].pathname, shcom);
      /* Then bind it to the pathname, and get it	listening properly */

      sock.sun_family = AF_UNIX;
      strcpy(sock.sun_path, shcom);
      if (bind(sockFD, (struct sockaddr *)&sock, sizeof(struct sockaddr_un)) < 0) {
        close(sockFD);
        free(UJ[sockFD].pathname);
        UJ[sockFD].type = UJUNUSED;
        perror("binding Lisp sockets");
        return (NIL);
      }
      DBPRINT(("Socket %d bound to name %s.\n", sockFD, shcom));
      if (listen(sockFD, 1) < 0) perror("Listen");
      /* Set up the IO not to block */
      fcntl(sockFD, F_SETFL, fcntl(sockFD, F_GETFL, 0) | O_NONBLOCK);

      /* things seem sane, fill out the rest of the UJ slot and return */
      UJ[sockFD].status = -1;
      UJ[sockFD].PID = -1;
      UJ[sockFD].type = UJSOCKET;

      return (GetSmallp(sockFD));
    }

    case 13: /* try to accept */
    {
      /* returns file descriptor if successful,
         -1 if no connection available,
         NIL if failure */
      int sockFD, newFD;

      N_GETNUMBER(args[1], sockFD, bad);
      if (UJ[sockFD].type == UJSOCKET && UJ[sockFD].pathname != NULL) {
      /* sockFD SHOULD be non-blocking;
         but I'll time this out just in case */
      case13_lp:
        TIMEOUT(newFD = accept(sockFD, NULL, NULL));
        if (newFD < 0)
          if (errno == EINTR)
            goto case13_lp;
          else if (errno == EWOULDBLOCK)
            return (GetSmallp(-1));
          else {
            perror("Lisp socket accept");
            return (NIL);
          }
        else {
          UJ[newFD].status = -1;
          UJ[newFD].PID = -1;
          UJ[newFD].type = UJSOSTREAM;
          return (GetSmallp(newFD));
        }
      } else
        return (NIL);
    }

    case 14: /* return type of socket */
    {
      int streamFD;

      N_GETNUMBER(args[1], streamFD, bad);
      if (valid_slot(streamFD))
        return GetSmallp(UJ[streamFD].type);
      else
        return NIL;
    }

    case 15: /* Write buffer */
    {
      DLword *bufp;
      int i;
      N_GETNUMBER(args[1], slot, bad);              /* Get job # */
      bufp = (NativeAligned2FromLAddr(args[2])); /* User buffer */
      N_GETNUMBER(args[3], i, bad);                 /* # to write */
      DBPRINT(("Write buffer, type is %d\n", UJ[slot].type));

      switch (UJ[slot].type) {
        case UJSHELL:
        case UJPROCESS:
        case UJSOSTREAM:
#ifdef BYTESWAP
          word_swap_page(bufp, (i + 3) >> 2);
#endif /* BYTESWAP */

          dest = write(slot, bufp, i);
#ifdef BYTESWAP
          word_swap_page(bufp, (i + 3) >> 2);
#endif /* BYTESWAP */

          if (dest > 0) return (GetSmallp(dest));
          /* Something's amiss; update process status */
          wait_for_comm_processes(); /* make sure we're up to date */
          if (((dest == 0) || (errno == EWOULDBLOCK)) && (UJ[slot].status == -1))
            /* No room to write, but other guy still running */
            return (ATOM_T);
          /* At this point, we either got an I/O error, or there */
          /* were no chars available and the other end has terminated. */
          /* Either way, signal EOF. */
          DBPRINT(("Indicating write failure from PTY desc %d.\n", slot));
          return (NIL);

        case UJUNUSED:
        case UJSOCKET:
          return (NIL);
      }
    }

    default: return (NIL);
  }

bad:
  DBPRINT(("Bad input value."));
  return (NIL);
}